

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall
xlib::Log::Format<unsigned_short,std::__cxx11::string,std::__cxx11::string>
          (Log *this,string *format,unsigned_short *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_1)

{
  ulong uVar1;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream oss;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_local;
  unsigned_short *first_local;
  string *format_local;
  Log *this_local;
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x13e44e);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::ostream::operator<<((ostream *)local_1b0,*first);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(string *)0x2);
    std::__cxx11::string::~string(local_1e0);
    Format<std::__cxx11::string,std::__cxx11::string>(this,format,rest,rest_1);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }